

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadExportSection(BinaryReader *this,Offset section_size)

{
  int iVar1;
  Result RVar2;
  char *desc;
  char *format;
  uint uVar3;
  ulong uVar4;
  ExternalKind kind;
  Index num_exports;
  uint32_t value;
  string_view name;
  ExternalKind local_54;
  uint local_50;
  uint local_4c;
  string_view local_48;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2b])();
  if (iVar1 == 0) {
    RVar2 = ReadCount(this,&local_50,"export count");
    if (RVar2.enum_ != Error) {
      iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2c])(this->delegate_,(ulong)local_50);
      if (iVar1 == 0) {
        if (local_50 != 0) {
          uVar4 = 0;
          do {
            local_48._M_len = 0;
            local_48._M_str = (char *)0x0;
            RVar2 = ReadStr(this,&local_48,"export item name");
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            RVar2 = ReadExternalKind(this,&local_54,desc);
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            RVar2 = ReadU32Leb128(this,&local_4c,"export item index");
            if (RVar2.enum_ == Error) {
              return (Result)Error;
            }
            if ((local_54 == Last) && ((this->options_->features).exceptions_enabled_ == false)) {
              format = "invalid export tag kind: exceptions not allowed";
              goto LAB_001139e8;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2d])
                              (this->delegate_,uVar4,(ulong)local_54,(ulong)local_4c,local_48._M_len
                               ,local_48._M_str);
            if (iVar1 != 0) {
              format = "OnExport callback failed";
              goto LAB_001139e8;
            }
            uVar3 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar3;
          } while (local_50 != uVar3);
        }
        iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x2e])();
        if (iVar1 == 0) {
          return (Result)Ok;
        }
        format = "EndExportSection callback failed";
      }
      else {
        format = "OnExportCount callback failed";
      }
LAB_001139e8:
      PrintError(this,format);
    }
  }
  else {
    PrintError(this,"BeginExportSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadExportSection(Offset section_size) {
  CALLBACK(BeginExportSection, section_size);
  Index num_exports;
  CHECK_RESULT(ReadCount(&num_exports, "export count"));
  CALLBACK(OnExportCount, num_exports);
  for (Index i = 0; i < num_exports; ++i) {
    std::string_view name;
    CHECK_RESULT(ReadStr(&name, "export item name"));

    ExternalKind kind;
    CHECK_RESULT(ReadExternalKind(&kind, "export kind"));

    Index item_index;
    CHECK_RESULT(ReadIndex(&item_index, "export item index"));
    if (kind == ExternalKind::Tag) {
      ERROR_UNLESS(options_.features.exceptions_enabled(),
                   "invalid export tag kind: exceptions not allowed");
    }

    CALLBACK(OnExport, i, static_cast<ExternalKind>(kind), item_index, name);
  }
  CALLBACK0(EndExportSection);
  return Result::Ok;
}